

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableNoCopy
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  ArenaImpl *this_00;
  bool bVar1;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *new_string;
  byte local_c1;
  LogMessage local_c0;
  ArenaImpl *local_88;
  Arena *arena_local;
  string *default_value_local;
  ArenaStringPtr *this_local;
  ArenaImpl *local_68;
  ArenaImpl *local_60;
  ArenaImpl *local_58;
  ArenaImpl *local_50;
  ArenaImpl *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined1 local_31;
  ArenaImpl *local_30;
  size_t local_28;
  size_t n;
  ArenaImpl *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_88 = (ArenaImpl *)arena;
  arena_local = (Arena *)default_value;
  default_value_local = (string *)this;
  bVar1 = IsDonatedString(this);
  if ((bVar1) || (bVar1 = IsDefault(this,(string *)arena_local), bVar1)) {
    bVar1 = IsDefault(this,(string *)arena_local);
    local_c1 = 0;
    if (!bVar1) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,"third_party/protobuf-lite/arenastring.cc",0x86);
      local_c1 = 1;
      other = LogMessage::operator<<(&local_c0,"CHECK failed: IsDefault(default_value): ");
      LogFinisher::operator=((LogFinisher *)((long)&new_string + 3),other);
    }
    if ((local_c1 & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
    this_00 = local_88;
    local_68 = local_88;
    local_60 = local_88;
    local_58 = local_88;
    local_50 = local_88;
    local_48 = local_88;
    if (local_88 == (ArenaImpl *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
      std::__cxx11::string::string((string *)pbVar2);
      local_40 = pbVar2;
    }
    else {
      local_30 = local_88;
      local_31 = 0;
      local_18 = local_88;
      n._7_1_ = 0;
      local_28 = AlignUpTo8(0x20);
      ArenaImpl::RecordAlloc(this_00,(type_info *)&std::__cxx11::string::typeinfo,local_28);
      if ((n._7_1_ & 1) == 0) {
        local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ArenaImpl::AllocateAlignedAndAddCleanup
                             (this_00,local_28,arena_destruct_object<std::__cxx11::string>);
      }
      else {
        local_10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   Arena::AllocateAlignedTo<8ul>((Arena *)this_00,0x20);
      }
      pbVar2 = local_10;
      std::__cxx11::string::string((string *)local_10);
      local_40 = pbVar2;
    }
    pbVar2 = local_40;
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (&this->tagged_ptr_,local_40);
    this_local = (ArenaStringPtr *)pbVar2;
  }
  else {
    this_local = (ArenaStringPtr *)UnsafeMutablePointer_abi_cxx11_(this);
  }
  return (string *)this_local;
}

Assistant:

std::string* ArenaStringPtr::MutableNoCopy(const std::string* default_value,
                                           ::google::protobuf::Arena* arena) {
  if (!IsDonatedString() && !IsDefault(default_value)) {
    return UnsafeMutablePointer();
  } else {
    GOOGLE_DCHECK(IsDefault(default_value));
    // Allocate empty. The contents are not relevant.
    std::string* new_string = Arena::Create<std::string>(arena);
    tagged_ptr_.Set(new_string);
    return new_string;
  }
}